

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  _Base_ptr p_Var1;
  Impl *pIVar2;
  Arg *params_1;
  Iface *pIVar3;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  MainImpl *pMVar4;
  bool bVar5;
  int iVar6;
  Arg *argSpec;
  iterator iVar7;
  iterator iVar8;
  Arg *pAVar9;
  iterator iVar10;
  StringPtr *pSVar12;
  ulong uVar13;
  size_t sVar14;
  _Rb_tree_header *p_Var15;
  undefined8 uVar16;
  Disposer *pDVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  ProcessContext *pPVar22;
  char *pcVar23;
  String *in_R9;
  char (*pacVar24) [22];
  StringPtr *pSVar25;
  Arg *params_00;
  char *pcVar26;
  kj *pkVar27;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  String *in_stack_fffffffffffffed8;
  undefined7 uStack_120;
  char c;
  MainImpl *local_118;
  NullableValue<kj::String> local_110;
  StringPtr programName_local;
  MainFunc subMain;
  ulong local_c0;
  StringPtr dummyArg;
  undefined8 uStack_a8;
  StringPtr param;
  StringPtr arg;
  Vector<kj::StringPtr> arguments;
  char *local_40;
  long local_38;
  _func_int **pp_Var11;
  
  pcVar23 = (char *)params.size_;
  pSVar12 = params.ptr;
  programName_local.content.size_ = programName.content.size_;
  programName_local.content.ptr = programName.content.ptr;
  arguments.builder.endPtr = (StringPtr *)0x0;
  arguments.builder.ptr = (StringPtr *)0x0;
  arguments.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  pcVar26 = (char *)0x0;
  pcVar21 = pcVar23;
  local_118 = this;
  do {
    uVar16 = uStack_a8;
    if (pcVar23 <= pcVar26) {
LAB_0026f85b:
      pIVar2 = (this->impl).ptr;
      if ((pIVar2->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        programName_13.content.size_ = programName_local.content.size_;
        programName_13.content.ptr = programName_local.content.ptr;
        message_04.content.size_ = 0x10;
        message_04.content.ptr = "missing command";
        usageError(local_118,programName_13,message_04);
      }
      params_00 = (pIVar2->args).builder.ptr;
      params_1 = (pIVar2->args).builder.pos;
      local_c0 = 0;
      for (pAVar9 = params_00; pAVar9 != params_1; pAVar9 = pAVar9 + 1) {
        local_c0 = (ulong)((int)local_c0 + pAVar9->minCount);
      }
      pkVar27 = (kj *)arguments.builder.ptr;
      for (; params_00 != params_1; params_00 = params_00 + 1) {
        lVar19 = -(long)pkVar27;
        pAVar9 = params_1;
        for (uVar20 = 0; uVar16 = uStack_a8, uVar20 < params_00->minCount; uVar20 = uVar20 + 1) {
          if (pkVar27 == (kj *)arguments.builder.pos) {
            programName_02.content.size_ = programName_local.content.size_;
            programName_02.content.ptr = programName_local.content.ptr;
            str<char_const(&)[18],kj::StringPtr&>
                      ((String *)&local_110,(kj *)"missing argument ",(char (*) [18])params_00,
                       &pAVar9->title);
            pcVar21 = (char *)local_110._0_8_;
            if (local_110.field_1.value.content.ptr == (char *)0x0) {
              pcVar21 = "";
            }
            message_00.content.size_ =
                 local_110.field_1.value.content.ptr +
                 (local_110.field_1.value.content.ptr == (char *)0x0);
            message_00.content.ptr = pcVar21;
            usageError(local_118,programName_02,message_00);
          }
          pAVar9 = *(Arg **)(pkVar27 + 8);
          pIVar3 = (params_00->callback).impl.ptr;
          (**pIVar3->_vptr_Iface)
                    ((NullableValue<kj::String> *)&dummyArg,pIVar3,*(undefined8 *)pkVar27);
          sVar14 = dummyArg.content.size_;
          subMain.impl.disposer =
               (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
          if ((char)dummyArg.content.ptr == '\x01') {
            dummyArg.content.size_ = 0;
            uStack_a8 = 0;
            local_110.field_1.value.content.ptr = (char *)sVar14;
            local_110.field_1.value.content.size_ = uVar16;
            pAVar9 = (Arg *)&subMain.impl.ptr;
            subMain.impl.ptr = (Iface *)0x0;
          }
          local_110.isSet = (bool)(char)dummyArg.content.ptr;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (local_110.isSet == true) {
            programName_01.content.size_ = programName_local.content.size_;
            programName_01.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,pkVar27,(StringPtr *)0x28b644,
                       (char (*) [3])&local_110.field_1,(String *)pcVar21);
            pDVar17 = subMain.impl.disposer;
            if (subMain.impl.ptr == (Iface *)0x0) {
              pDVar17 = (Disposer *)0x2b02ed;
            }
            message.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message.content.ptr = (char *)pDVar17;
            usageError(local_118,programName_01,message);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
          pkVar27 = pkVar27 + 0x10;
          lVar19 = lVar19 + -0x10;
        }
        local_c0 = (ulong)((int)local_c0 - uVar20);
        for (; (uVar16 = uStack_a8, uVar20 < params_00->maxCount &&
               ((long)local_c0 < (long)&((arguments.builder.pos)->content).ptr + lVar19 >> 4));
            lVar19 = lVar19 + -0x10) {
          pIVar3 = (params_00->callback).impl.ptr;
          (**pIVar3->_vptr_Iface)
                    ((NullableValue<kj::String> *)&dummyArg,pIVar3,*(undefined8 *)pkVar27,
                     *(undefined8 *)(pkVar27 + 8));
          sVar14 = dummyArg.content.size_;
          subMain.impl.disposer =
               (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
          if ((char)dummyArg.content.ptr == '\x01') {
            dummyArg.content.size_ = 0;
            uStack_a8 = 0;
            local_110.field_1.value.content.ptr = (char *)sVar14;
            local_110.field_1.value.content.size_ = uVar16;
            subMain.impl.ptr = (Iface *)0x0;
          }
          local_110.isSet = (bool)(char)dummyArg.content.ptr;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (local_110.isSet == true) {
            programName_03.content.size_ = programName_local.content.size_;
            programName_03.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,pkVar27,(StringPtr *)0x28b644,
                       (char (*) [3])&local_110.field_1,(String *)pcVar21);
            pDVar17 = subMain.impl.disposer;
            if (subMain.impl.ptr == (Iface *)0x0) {
              pDVar17 = (Disposer *)0x2b02ed;
            }
            message_01.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_01.content.ptr = (char *)pDVar17;
            usageError(local_118,programName_03,message_01);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
          pkVar27 = pkVar27 + 0x10;
          uVar20 = uVar20 + 1;
        }
      }
      if (pkVar27 < arguments.builder.pos) {
        programName_14.content.size_ = programName_local.content.size_;
        programName_14.content.ptr = programName_local.content.ptr;
        str<kj::StringPtr&,char_const(&)[21]>
                  ((String *)&local_110,pkVar27,(StringPtr *)": too many arguments",
                   (char (*) [21])params_1);
        pcVar21 = (char *)local_110._0_8_;
        if (local_110.field_1.value.content.ptr == (char *)0x0) {
          pcVar21 = "";
        }
        message_11.content.size_ =
             local_110.field_1.value.content.ptr +
             (local_110.field_1.value.content.ptr == (char *)0x0);
        message_11.content.ptr = pcVar21;
        usageError(local_118,programName_14,message_11);
      }
      pIVar2 = (local_118->impl).ptr;
      if ((pIVar2->finalCallback).ptr.isSet == true) {
        (**((pIVar2->finalCallback).ptr.field_1.value.impl.ptr)->_vptr_Iface)(&dummyArg);
        sVar14 = dummyArg.content.size_;
        subMain.impl.disposer =
             (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
        if ((char)dummyArg.content.ptr == '\x01') {
          dummyArg.content.size_ = 0;
          local_110.field_1.value.content.ptr = (char *)sVar14;
          local_110.field_1.value.content.size_ = uStack_a8;
          subMain.impl.ptr = (Iface *)0x0;
          local_110.isSet = true;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          programName_16.content.size_ = programName_local.content.size_;
          programName_16.content.ptr = programName_local.content.ptr;
          uVar16 = local_110.field_1.value.content.ptr;
          if (local_110.field_1.value.content.size_ == 0) {
            uVar16 = "";
          }
          message_12.content.size_ =
               local_110.field_1.value.content.size_ + (local_110.field_1.value.content.size_ == 0);
          message_12.content.ptr = (char *)uVar16;
          usageError(local_118,programName_16,message_12);
        }
        local_110.isSet = (bool)(char)dummyArg.content.ptr;
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
      }
LAB_0026fa97:
      ArrayBuilder<kj::StringPtr>::dispose(&arguments.builder);
      return;
    }
    param.content.ptr = pSVar12[(long)pcVar26].content.ptr;
    param.content.size_ = pSVar12[(long)pcVar26].content.size_;
    local_110._0_8_ = "--";
    local_110.field_1.value.content.ptr = (char *)0x3;
    bVar5 = StringPtr::operator==(&param,(StringPtr *)&local_110);
    if (bVar5) {
      Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
                (&arguments,pSVar12 + (long)(pcVar26 + 1),pSVar12 + (long)pcVar23);
      this = local_118;
      goto LAB_0026f85b;
    }
    local_110._0_8_ = "--";
    local_110.field_1.value.content.ptr = (char *)0x3;
    bVar5 = StringPtr::startsWith(&param,(StringPtr *)&local_110);
    this = local_118;
    if (bVar5) {
      arg.content.ptr = (char *)0x0;
      arg.content.size_ = 0;
      StringPtr::findFirst((StringPtr *)&local_110,(char)&param);
      bVar5 = local_110.isSet;
      if (local_110.isSet == true) {
        arg.content.size_ = (size_t)(local_110.field_1.value.content.ptr + -2);
        local_38 = param.content.size_ - (long)(local_110.field_1.value.content.ptr + 1);
        local_40 = local_110.field_1.value.content.ptr + (long)param.content.ptr + 1;
      }
      else {
        arg.content.size_ = param.content.size_ - 3;
      }
      arg.content.ptr = param.content.ptr + 2;
      iVar8 = std::
              _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
              ::find(&(((this->impl).ptr)->longOptions)._M_t,&arg.content);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(((this->impl).ptr)->longOptions)._M_t._M_impl.super__Rb_tree_header) {
        local_110._0_8_ = "--help";
        local_110.field_1.value.content.ptr = (char *)0x7;
        bVar5 = StringPtr::operator==(&param,(StringPtr *)&local_110);
        programName_07.content.size_ = programName_local.content.size_;
        programName_07.content.ptr = programName_local.content.ptr;
        programName_06.content.size_ = programName_local.content.size_;
        programName_06.content.ptr = programName_local.content.ptr;
        if (!bVar5) {
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                    ((String *)&local_110,(kj *)"--",(char (*) [3])&arg,
                     (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pcVar21);
          pcVar21 = (char *)local_110._0_8_;
          if (local_110.field_1.value.content.ptr == (char *)0x0) {
            pcVar21 = "";
          }
          message_07.content.size_ =
               local_110.field_1.value.content.ptr +
               (local_110.field_1.value.content.ptr == (char *)0x0);
          message_07.content.ptr = pcVar21;
          usageError(local_118,programName_07,message_07);
        }
        printHelp(local_118,programName_06);
      }
      p_Var1 = iVar8._M_node[1]._M_left;
      if (*(char *)&p_Var1->_M_left == '\x01') {
        if (bVar5 == false) {
          if (pcVar23 <= pcVar26 + 1) {
LAB_0026ff08:
            programName_10.content.size_ = programName_local.content.size_;
            programName_10.content.ptr = programName_local.content.ptr;
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                      ((String *)&local_110,(kj *)"--",(char (*) [3])&arg,
                       (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pcVar21);
            pcVar21 = (char *)local_110._0_8_;
            if (local_110.field_1.value.content.ptr == (char *)0x0) {
              pcVar21 = "";
            }
            message_08.content.size_ =
                 local_110.field_1.value.content.ptr +
                 (local_110.field_1.value.content.ptr == (char *)0x0);
            message_08.content.ptr = pcVar21;
            usageError(local_118,programName_10,message_08);
          }
          pSVar25 = pSVar12 + (long)(pcVar26 + 1);
          local_110._0_8_ = "-";
          local_110.field_1.value.content.ptr = (char *)0x2;
          bVar5 = StringPtr::startsWith(pSVar25,(StringPtr *)&local_110);
          if (bVar5) {
            sVar14 = (pSVar25->content).size_;
            if (1 < sVar14 - 1) goto LAB_0026ff08;
          }
          else {
            sVar14 = (pSVar25->content).size_;
          }
          p_Var1 = p_Var1->_M_right->_M_parent;
          (*(code *)**(undefined8 **)p_Var1)(&dummyArg,p_Var1,(pSVar25->content).ptr,sVar14);
          sVar14 = dummyArg.content.size_;
          subMain.impl.disposer =
               (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
          if ((char)dummyArg.content.ptr == '\x01') {
            dummyArg.content.size_ = 0;
            uStack_a8 = 0;
            local_110.field_1.value.content.ptr = (char *)sVar14;
            local_110.field_1.value.content.size_ = uVar16;
            subMain.impl.ptr = (Iface *)0x0;
          }
          local_110.isSet = (bool)(char)dummyArg.content.ptr;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (local_110.isSet == true) {
            programName_11.content.size_ = programName_local.content.size_;
            programName_11.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,(kj *)&param,(StringPtr *)"=",(char (*) [2])pSVar25,
                       (StringPtr *)0x28b644,(char (*) [3])&local_110.field_1,
                       in_stack_fffffffffffffed8);
            pDVar17 = subMain.impl.disposer;
            if (subMain.impl.ptr == (Iface *)0x0) {
              pDVar17 = (Disposer *)0x2b02ed;
            }
            message_09.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_09.content.ptr = (char *)pDVar17;
            usageError(local_118,programName_11,message_09);
          }
LAB_0026f636:
          pcVar26 = pcVar26 + 1;
          kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
          this = local_118;
          goto LAB_0026f643;
        }
        p_Var1 = p_Var1->_M_right->_M_parent;
        (*(code *)**(undefined8 **)p_Var1)(&dummyArg,p_Var1,local_40,local_38);
        sVar14 = dummyArg.content.size_;
        subMain.impl.disposer =
             (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
        if ((char)dummyArg.content.ptr == '\x01') {
          dummyArg.content.size_ = 0;
          uStack_a8 = 0;
          local_110.field_1.value.content.ptr = (char *)sVar14;
          local_110.field_1.value.content.size_ = uVar16;
          subMain.impl.ptr = (Iface *)0x0;
        }
        local_110.isSet = (bool)(char)dummyArg.content.ptr;
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        if (local_110.isSet == true) {
          programName_12.content.size_ = programName_local.content.size_;
          programName_12.content.ptr = programName_local.content.ptr;
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    ((String *)&subMain,(kj *)&param,(StringPtr *)0x28b644,
                     (char (*) [3])&local_110.field_1,(String *)pcVar21);
          pDVar17 = subMain.impl.disposer;
          if (subMain.impl.ptr == (Iface *)0x0) {
            pDVar17 = (Disposer *)0x2b02ed;
          }
          message_10.content.size_ =
               (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
          message_10.content.ptr = (char *)pDVar17;
          usageError(local_118,programName_12,message_10);
        }
      }
      else {
        if (bVar5 != false) {
          programName_09.content.size_ = programName_local.content.size_;
          programName_09.content.ptr = programName_local.content.ptr;
          str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                    ((String *)&local_110,(kj *)"--",(char (*) [3])&arg,
                     (ArrayPtr<const_char> *)": option does not accept an argument",
                     (char (*) [37])pcVar21);
          pcVar21 = (char *)local_110._0_8_;
          if (local_110.field_1.value.content.ptr == (char *)0x0) {
            pcVar21 = "";
          }
          message_06.content.size_ =
               local_110.field_1.value.content.ptr +
               (local_110.field_1.value.content.ptr == (char *)0x0);
          message_06.content.ptr = pcVar21;
          usageError(local_118,programName_09,message_06);
        }
        (*(code *)**(undefined8 **)p_Var1->_M_right->_M_parent)(&dummyArg);
        sVar14 = dummyArg.content.size_;
        subMain.impl.disposer =
             (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
        if ((char)dummyArg.content.ptr == '\x01') {
          dummyArg.content.size_ = 0;
          uStack_a8 = 0;
          local_110.field_1.value.content.ptr = (char *)sVar14;
          local_110.field_1.value.content.size_ = uVar16;
          subMain.impl.ptr = (Iface *)0x0;
        }
        local_110.isSet = (bool)(char)dummyArg.content.ptr;
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
        kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
        if (local_110.isSet == true) {
          programName_08.content.size_ = programName_local.content.size_;
          programName_08.content.ptr = programName_local.content.ptr;
          str<kj::StringPtr&,char_const(&)[3],kj::String&>
                    ((String *)&subMain,(kj *)&param,(StringPtr *)0x28b644,
                     (char (*) [3])&local_110.field_1,(String *)pcVar21);
          pDVar17 = subMain.impl.disposer;
          if (subMain.impl.ptr == (Iface *)0x0) {
            pDVar17 = (Disposer *)0x2b02ed;
          }
          message_05.content.size_ =
               (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
          message_05.content.ptr = (char *)pDVar17;
          usageError(local_118,programName_08,message_05);
        }
      }
LAB_0026f547:
      kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
    }
    else {
      local_110._0_8_ = "-";
      local_110.field_1.value.content.ptr = (char *)0x2;
      bVar5 = StringPtr::startsWith(&param,(StringPtr *)&local_110);
      if ((bVar5) && (param.content.size_ - 3 < 0xfffffffffffffffe)) {
        uVar18 = 2;
        while( true ) {
          uVar16 = uStack_a8;
          uVar13 = (ulong)((int)uVar18 - 1);
          if (param.content.size_ - 1 <= uVar13) break;
          c = param.content.ptr[uVar13];
          iVar7 = std::
                  _Rb_tree<char,_std::pair<const_char,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
                  ::find(&(((this->impl).ptr)->shortOptions)._M_t,&c);
          if ((_Rb_tree_header *)iVar7._M_node ==
              &(((this->impl).ptr)->shortOptions)._M_t._M_impl.super__Rb_tree_header) {
            programName_04.content.size_ = programName_local.content.size_;
            programName_04.content.ptr = programName_local.content.ptr;
            str<char_const(&)[2],char&,char_const(&)[22]>
                      ((String *)&local_110,(kj *)0x2b00fe,(char (*) [2])&c,": unrecognized option",
                       (char (*) [22])pcVar21);
            pcVar21 = (char *)local_110._0_8_;
            if (local_110.field_1.value.content.ptr == (char *)0x0) {
              pcVar21 = "";
            }
            message_02.content.size_ =
                 local_110.field_1.value.content.ptr +
                 (local_110.field_1.value.content.ptr == (char *)0x0);
            message_02.content.ptr = pcVar21;
            usageError(local_118,programName_04,message_02);
          }
          p_Var1 = iVar7._M_node[1]._M_parent;
          if (*(char *)&p_Var1->_M_left == '\x01') {
            if (uVar18 < param.content.size_ - 1) {
              arg.content.size_ = param.content.size_ - uVar18;
              arg.content.ptr = param.content.ptr + uVar18;
              (*(code *)**(undefined8 **)p_Var1->_M_right->_M_parent)(&dummyArg);
              sVar14 = dummyArg.content.size_;
              subMain.impl.disposer =
                   (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
              if ((char)dummyArg.content.ptr == '\x01') {
                dummyArg.content.size_ = 0;
                uStack_a8 = 0;
                local_110.field_1.value.content.ptr = (char *)sVar14;
                local_110.field_1.value.content.size_ = uVar16;
                subMain.impl.ptr = (Iface *)0x0;
              }
              local_110.isSet = (bool)(char)dummyArg.content.ptr;
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)&subMain);
              kj::_::NullableValue<kj::String>::~NullableValue
                        ((NullableValue<kj::String> *)&dummyArg);
              if (local_110.isSet == true) {
                programName_17.content.size_ = programName_local.content.size_;
                programName_17.content.ptr = programName_local.content.ptr;
                str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                          ((String *)&subMain,(kj *)0x2b00fe,(char (*) [2])&c," ",(char (*) [2])&arg
                           ,(StringPtr *)0x28b644,(char (*) [3])&local_110.field_1,
                           (String *)CONCAT17(c,uStack_120));
                pDVar17 = subMain.impl.disposer;
                if (subMain.impl.ptr == (Iface *)0x0) {
                  pDVar17 = (Disposer *)0x2b02ed;
                }
                message_15.content.size_ =
                     (long)&(subMain.impl.ptr)->_vptr_Iface +
                     (ulong)(subMain.impl.ptr == (Iface *)0x0);
                message_15.content.ptr = (char *)pDVar17;
                usageError(local_118,programName_17,message_15);
              }
              goto LAB_0026f547;
            }
            if (pcVar23 <= pcVar26 + 1) {
LAB_002700a5:
              programName_15.content.size_ = programName_local.content.size_;
              programName_15.content.ptr = programName_local.content.ptr;
              str<char_const(&)[2],char&,char_const(&)[19]>
                        ((String *)&local_110,(kj *)0x2b00fe,(char (*) [2])&c,": missing argument",
                         (char (*) [19])pcVar21);
              pcVar21 = (char *)local_110._0_8_;
              if (local_110.field_1.value.content.ptr == (char *)0x0) {
                pcVar21 = "";
              }
              message_13.content.size_ =
                   local_110.field_1.value.content.ptr +
                   (local_110.field_1.value.content.ptr == (char *)0x0);
              message_13.content.ptr = pcVar21;
              usageError(local_118,programName_15,message_13);
            }
            pSVar25 = pSVar12 + (long)(pcVar26 + 1);
            local_110._0_8_ = "-";
            local_110.field_1.value.content.ptr = (char *)0x2;
            bVar5 = StringPtr::startsWith(pSVar25,(StringPtr *)&local_110);
            if (bVar5) {
              sVar14 = (pSVar25->content).size_;
              if (1 < sVar14 - 1) goto LAB_002700a5;
            }
            else {
              sVar14 = (pSVar25->content).size_;
            }
            p_Var1 = p_Var1->_M_right->_M_parent;
            (*(code *)**(undefined8 **)p_Var1)(&dummyArg,p_Var1,(pSVar25->content).ptr,sVar14);
            sVar14 = dummyArg.content.size_;
            subMain.impl.disposer =
                 (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
            if ((char)dummyArg.content.ptr == '\x01') {
              dummyArg.content.size_ = 0;
              uStack_a8 = 0;
              local_110.field_1.value.content.ptr = (char *)sVar14;
              local_110.field_1.value.content.size_ = uVar16;
              subMain.impl.ptr = (Iface *)0x0;
            }
            local_110.isSet = (bool)(char)dummyArg.content.ptr;
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
            kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg)
            ;
            if (local_110.isSet == true) {
              programName_00.content.size_ = programName_local.content.size_;
              programName_00.content.ptr = programName_local.content.ptr;
              str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                        ((String *)&subMain,(kj *)0x2b00fe,(char (*) [2])&c," ",
                         (char (*) [2])pSVar25,(StringPtr *)0x28b644,
                         (char (*) [3])&local_110.field_1,(String *)CONCAT17(c,uStack_120));
              pDVar17 = subMain.impl.disposer;
              if (subMain.impl.ptr == (Iface *)0x0) {
                pDVar17 = (Disposer *)0x2b02ed;
              }
              message_14.content.size_ =
                   (long)&(subMain.impl.ptr)->_vptr_Iface +
                   (ulong)(subMain.impl.ptr == (Iface *)0x0);
              message_14.content.ptr = (char *)pDVar17;
              usageError(local_118,programName_00,message_14);
            }
            goto LAB_0026f636;
          }
          (*(code *)**(undefined8 **)p_Var1->_M_right->_M_parent)(&dummyArg);
          sVar14 = dummyArg.content.size_;
          subMain.impl.disposer =
               (Disposer *)CONCAT71(subMain.impl.disposer._1_7_,(char)dummyArg.content.ptr);
          if ((char)dummyArg.content.ptr == '\x01') {
            dummyArg.content.size_ = 0;
            uStack_a8 = 0;
            local_110.field_1.value.content.ptr = (char *)sVar14;
            local_110.field_1.value.content.size_ = uVar16;
            subMain.impl.ptr = (Iface *)0x0;
          }
          local_110.isSet = (bool)(char)dummyArg.content.ptr;
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&subMain);
          kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&dummyArg);
          if (local_110.isSet == true) {
            programName_05.content.size_ = programName_local.content.size_;
            programName_05.content.ptr = programName_local.content.ptr;
            str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                      ((String *)&subMain,(kj *)0x2b00fe,(char (*) [2])&c,": ",
                       (char (*) [3])&local_110.field_1,in_R9);
            pDVar17 = subMain.impl.disposer;
            if (subMain.impl.ptr == (Iface *)0x0) {
              pDVar17 = (Disposer *)0x2b02ed;
            }
            message_03.content.size_ =
                 (long)&(subMain.impl.ptr)->_vptr_Iface + (ulong)(subMain.impl.ptr == (Iface *)0x0);
            message_03.content.ptr = (char *)pDVar17;
            usageError(local_118,programName_05,message_03);
          }
          kj::_::NullableValue<kj::String>::~NullableValue(&local_110);
          uVar18 = (ulong)((int)uVar18 + 1);
        }
      }
      else {
        pIVar2 = (this->impl).ptr;
        if ((pIVar2->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar10 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar2->subCommands)._M_t,&param);
          p_Var15 = &(((this->impl).ptr)->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node != p_Var15) {
            (*(code *)**(undefined8 **)iVar10._M_node[1]._M_right)(&subMain);
            dummyArg.content.ptr = (char *)CONCAT71(dummyArg.content.ptr._1_7_,0x20);
            str<kj::StringPtr&,char,kj::StringPtr&>
                      ((String *)&local_110,(kj *)&programName_local,&dummyArg,(char *)&param,
                       (StringPtr *)pcVar21);
            pcVar21 = (char *)local_110._0_8_;
            if (local_110.field_1.value.content.ptr == (char *)0x0) {
              pcVar21 = "";
            }
            (**(subMain.impl.ptr)->_vptr_Iface)
                      (subMain.impl.ptr,pcVar21,
                       local_110.field_1.value.content.ptr +
                       (local_110.field_1.value.content.ptr == (char *)0x0),
                       pSVar12 + (long)(pcVar26 + 1),(long)pcVar23 - (long)(pcVar26 + 1));
            Array<char>::~Array((Array<char> *)&local_110);
            Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Iface>::
            dispose(&subMain.impl);
            goto LAB_0026fa97;
          }
          local_110._0_8_ = "help";
          local_110.field_1.value.content.ptr = (char *)0x5;
          bVar5 = StringPtr::operator==(&param,(StringPtr *)&local_110);
          pMVar4 = local_118;
          if (!bVar5) {
            programName_18.content.size_ = programName_local.content.size_;
            programName_18.content.ptr = programName_local.content.ptr;
            str<kj::StringPtr&,char_const(&)[18]>
                      ((String *)&local_110,(kj *)&param,(StringPtr *)": unknown command",
                       (char (*) [18])p_Var15);
            pcVar21 = (char *)local_110._0_8_;
            if (local_110.field_1.value.content.ptr == (char *)0x0) {
              pcVar21 = "";
            }
            message_16.content.size_ =
                 local_110.field_1.value.content.ptr +
                 (local_110.field_1.value.content.ptr == (char *)0x0);
            message_16.content.ptr = pcVar21;
            usageError(local_118,programName_18,message_16);
          }
          if (pcVar23 <= pcVar26 + 1) {
            programName_19.content.size_ = programName_local.content.size_;
            programName_19.content.ptr = programName_local.content.ptr;
            printHelp(local_118,programName_19);
          }
          pkVar27 = (kj *)(pSVar12 + (long)(pcVar26 + 1));
          iVar10 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(((local_118->impl).ptr)->subCommands)._M_t,(key_type *)pkVar27);
          p_Var15 = &(((pMVar4->impl).ptr)->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar10._M_node == p_Var15) {
            local_110._0_8_ = "help";
            local_110.field_1.value.content.ptr = (char *)0x5;
            bVar5 = StringPtr::operator==((StringPtr *)pkVar27,(StringPtr *)&local_110);
            if (!bVar5) {
              programName_20.content.size_ = programName_local.content.size_;
              programName_20.content.ptr = programName_local.content.ptr;
              str<kj::StringPtr_const&,char_const(&)[18]>
                        ((String *)&local_110,pkVar27,(StringPtr *)": unknown command",
                         (char (*) [18])p_Var15);
              pcVar21 = (char *)local_110._0_8_;
              if (local_110.field_1.value.content.ptr == (char *)0x0) {
                pcVar21 = "";
              }
              message_17.content.size_ =
                   local_110.field_1.value.content.ptr +
                   (local_110.field_1.value.content.ptr == (char *)0x0);
              message_17.content.ptr = pcVar21;
              usageError(local_118,programName_20,message_17);
            }
            uVar20 = 0;
            break;
          }
          (*(code *)**(undefined8 **)iVar10._M_node[1]._M_right)(&subMain);
          dummyArg.content.ptr = "--help";
          dummyArg.content.size_ = 7;
          arg.content.ptr = (char *)CONCAT71(arg.content.ptr._1_7_,0x20);
          str<kj::StringPtr&,char,kj::StringPtr_const&>
                    ((String *)&local_110,(kj *)&programName_local,&arg,(char *)pkVar27,
                     (StringPtr *)pcVar21);
          pcVar21 = (char *)local_110._0_8_;
          if (local_110.field_1.value.content.ptr == (char *)0x0) {
            pcVar21 = "";
          }
          (**(subMain.impl.ptr)->_vptr_Iface)
                    (subMain.impl.ptr,pcVar21,
                     local_110.field_1.value.content.ptr +
                     (local_110.field_1.value.content.ptr == (char *)0x0),&dummyArg,1);
          Array<char>::~Array((Array<char> *)&local_110);
          Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Iface>::dispose
                    (&subMain.impl);
          goto LAB_0026fa97;
        }
        Vector<kj::StringPtr>::add<kj::StringPtr&>(&arguments,&param);
      }
    }
LAB_0026f643:
    pcVar26 = pcVar26 + 1;
  } while( true );
LAB_002702e5:
  pacVar24 = (char (*) [22])(ulong)((int)pcVar26 + 2 + uVar20);
  if (pcVar23 <= pacVar24) {
LAB_00270370:
    if (uVar20 == 0) {
      pPVar22 = ((local_118->impl).ptr)->context;
      pp_Var11 = pPVar22->_vptr_ProcessContext + 5;
      uVar16 = 0x27;
      pcVar21 = "Help about help?  We must go deeper...";
    }
    else if (uVar20 == 1) {
      pPVar22 = ((local_118->impl).ptr)->context;
      pp_Var11 = pPVar22->_vptr_ProcessContext + 5;
      uVar16 = 0x6d;
      pcVar21 = 
      "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
      ;
    }
    else if (uVar20 == 2) {
      pPVar22 = ((local_118->impl).ptr)->context;
      pp_Var11 = pPVar22->_vptr_ProcessContext + 5;
      uVar16 = 0x2a;
      pcVar21 = "Help, I\'m trapped in a help text factory!";
    }
    else {
      pPVar22 = ((local_118->impl).ptr)->context;
      if (uVar20 < 10) {
        pp_Var11 = pPVar22->_vptr_ProcessContext + 4;
        uVar16 = 0x1f;
        pcVar21 = "Killed by signal 911 (SIGHELP)";
      }
      else {
        pp_Var11 = pPVar22->_vptr_ProcessContext + 5;
        uVar16 = 0x1d;
        pcVar21 = "How to keep an idiot busy...";
      }
    }
    iVar6 = (**pp_Var11)(pPVar22,pcVar21,uVar16);
    Array<char>::~Array((Array<char> *)&local_110);
    ArrayBuilder<kj::StringPtr>::dispose(&arguments.builder);
    _Unwind_Resume(iVar6);
  }
  local_110._0_8_ = "help";
  local_110.field_1.value.content.ptr = (char *)0x5;
  bVar5 = StringPtr::operator==(pSVar12 + (long)pacVar24,(StringPtr *)&local_110);
  if (!bVar5) {
    subMain.impl.disposer = (Disposer *)anon_var_dwarf_318706;
    subMain.impl.ptr = (Iface *)0x7;
    bVar5 = StringPtr::operator==(pSVar12 + (long)pacVar24,(StringPtr *)&subMain);
    if (!bVar5) goto LAB_00270370;
  }
  uVar20 = uVar20 + 1;
  goto LAB_002702e5;
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_MAYBE(pos, param.findFirst('=')) {
        name = param.slice(2, *pos);
        maybeArg = param.slice(*pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_MAYBE(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_MAYBE(error, (*option.funcWithArg)(*arg).releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_MAYBE(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == nullptr) {
            KJ_IF_MAYBE(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }